

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O3

void __thiscall
miniros::Publication::addCallbacks(Publication *this,SubscriberCallbacksPtr *callbacks)

{
  element_type *peVar1;
  pointer psVar2;
  CallbackQueueInterface *pCVar3;
  int iVar4;
  pointer __args_1;
  pthread_mutex_t *__mutex;
  undefined1 local_69;
  pthread_mutex_t *local_68;
  pthread_mutex_t *local_60;
  undefined8 local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  __mutex = (pthread_mutex_t *)&this->callbacks_mutex_;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  std::
  vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
  ::push_back(&this->callbacks_,callbacks);
  peVar1 = (callbacks->super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  if (((peVar1->connect_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (peVar1->callback_queue_ != (CallbackQueueInterface *)0x0)) {
    local_60 = (pthread_mutex_t *)&this->subscriber_links_mutex_;
    local_68 = __mutex;
    iVar4 = pthread_mutex_lock(local_60);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    __args_1 = (this->subscriber_links_).
               super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->subscriber_links_).
             super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__args_1 != psVar2) {
      do {
        peVar1 = (callbacks->
                 super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        local_58 = (PeerConnDisconnCallback *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<miniros::PeerConnDisconnCallback,std::allocator<miniros::PeerConnDisconnCallback>,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::shared_ptr<miniros::SubscriberLink>const&,bool&,std::weak_ptr<void_const>&>
                  (&_Stack_50,(PeerConnDisconnCallback **)&local_58,
                   (allocator<miniros::PeerConnDisconnCallback> *)&local_69,&peVar1->connect_,
                   __args_1,&peVar1->has_tracked_object_,&peVar1->tracked_object_);
        local_48 = (undefined4)local_58;
        uStack_44 = local_58._4_4_;
        uStack_40 = _Stack_50._M_pi._0_4_;
        uStack_3c = _Stack_50._M_pi._4_4_;
        pCVar3 = ((callbacks->
                  super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr)->callback_queue_;
        (*pCVar3->_vptr_CallbackQueueInterface[2])(pCVar3,&local_48);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_3c,uStack_40) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_3c,uStack_40));
        }
        __args_1 = __args_1 + 1;
      } while (__args_1 != psVar2);
    }
    pthread_mutex_unlock(local_60);
    __mutex = local_68;
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void Publication::addCallbacks(const SubscriberCallbacksPtr& callbacks)
{
  std::scoped_lock<std::mutex> lock(callbacks_mutex_);

  callbacks_.push_back(callbacks);

  // Add connect callbacks for all current subscriptions if this publisher wants them
  if (callbacks->connect_ && callbacks->callback_queue_)
  {
    std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);
    V_SubscriberLink::iterator it = subscriber_links_.begin();
    V_SubscriberLink::iterator end = subscriber_links_.end();
    for (; it != end; ++it)
    {
      const SubscriberLinkPtr& sub_link = *it;
      CallbackInterfacePtr cb(std::make_shared<PeerConnDisconnCallback>(callbacks->connect_, sub_link, callbacks->has_tracked_object_, callbacks->tracked_object_));
      callbacks->callback_queue_->addCallback(cb, (uint64_t)callbacks.get());
    }
  }
}